

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O3

xmlNsPtr xmlDOMWrapNSNormDeclareNsForced
                   (xmlDocPtr doc,xmlNodePtr elem,xmlChar *nsName,xmlChar *prefix,int checkShadow)

{
  int iVar1;
  xmlNsPtr pxVar2;
  _xmlNs *p_Var3;
  xmlNsPtr ns;
  _xmlNs *p_Var4;
  _xmlDoc *p_Var5;
  _xmlNs *p_Var6;
  xmlNs *pxVar7;
  xmlChar *str1;
  uint uVar8;
  char buf [50];
  xmlChar local_68 [56];
  
  if (doc->type == XML_ELEMENT_NODE) {
    p_Var6 = (_xmlNs *)&doc->oldNs;
    uVar8 = 0;
    str1 = nsName;
LAB_0015051c:
    for (p_Var4 = *(_xmlNs **)p_Var6; p_Var4 != (_xmlNs *)0x0; p_Var4 = p_Var4->next) {
      if ((p_Var4->prefix == str1) || (iVar1 = xmlStrEqual(str1,p_Var4->prefix), iVar1 != 0))
      goto LAB_001505ec;
    }
    if (((((int)prefix == 0) || (p_Var5 = (_xmlDoc *)doc->parent, p_Var5 == (_xmlDoc *)0x0)) ||
        (p_Var5->doc == p_Var5)) || (p_Var5->type == XML_NAMESPACE_DECL)) {
LAB_0015063d:
      pxVar2 = xmlNewNs((xmlNodePtr)0x0,(xmlChar *)elem,str1);
      if (pxVar2 != (xmlNsPtr)0x0) {
        p_Var4 = *(_xmlNs **)p_Var6;
        while (p_Var3 = p_Var4, p_Var3 != (_xmlNs *)0x0) {
          p_Var6 = p_Var3;
          p_Var4 = p_Var3->next;
        }
        p_Var6->next = pxVar2;
        return pxVar2;
      }
      return (xmlNsPtr)0x0;
    }
    if (((str1 == (xmlChar *)0x0) || (*str1 != 'x')) ||
       ((str1[1] != 'm' || ((str1[2] != 'l' || (str1[3] != '\0')))))) {
      do {
        if (((_xmlNode *)p_Var5)->type == XML_ELEMENT_NODE) {
          for (pxVar7 = ((_xmlNode *)p_Var5)->nsDef; pxVar7 != (xmlNs *)0x0; pxVar7 = pxVar7->next)
          {
            if ((pxVar7->prefix == str1) || (iVar1 = xmlStrEqual(str1,pxVar7->prefix), iVar1 != 0))
            {
              if (pxVar7->href == (xmlChar *)0x0) goto LAB_0015063d;
              goto LAB_001505ec;
            }
          }
        }
        else if (((_xmlNode *)p_Var5)->type == XML_ENTITY_DECL) goto LAB_0015063d;
        p_Var5 = (_xmlDoc *)((_xmlNode *)p_Var5)->parent;
        if ((p_Var5 == (_xmlDoc *)0x0) || (p_Var5->doc == p_Var5)) goto LAB_0015063d;
      } while( true );
    }
LAB_001505ec:
    if (uVar8 != 1000) {
      uVar8 = uVar8 + 1;
      str1 = local_68;
      if (nsName == (xmlChar *)0x0) {
        snprintf((char *)str1,0x32,"ns_%d",(ulong)uVar8);
      }
      else {
        snprintf((char *)str1,0x32,"%.30s_%d",nsName,(ulong)uVar8);
      }
      goto LAB_0015051c;
    }
  }
  return (xmlNsPtr)0x0;
}

Assistant:

static xmlNsPtr
xmlDOMWrapNSNormDeclareNsForced(xmlDocPtr doc,
				xmlNodePtr elem,
				const xmlChar *nsName,
				const xmlChar *prefix,
				int checkShadow)
{

    xmlNsPtr ret;
    char buf[50];
    const xmlChar *pref;
    int counter = 0;

    if ((doc == NULL) || (elem == NULL) || (elem->type != XML_ELEMENT_NODE))
        return(NULL);
    /*
    * Create a ns-decl on @anchor.
    */
    pref = prefix;
    while (1) {
	/*
	* Lookup whether the prefix is unused in elem's ns-decls.
	*/
	if ((elem->nsDef != NULL) &&
	    (xmlTreeNSListLookupByPrefix(elem->nsDef, pref) != NULL))
	    goto ns_next_prefix;
	if (checkShadow && elem->parent &&
	    ((xmlNodePtr) elem->parent->doc != elem->parent)) {
	    /*
	    * Does it shadow ancestor ns-decls?
	    */
	    if (xmlSearchNsByPrefixStrict(doc, elem->parent, pref, NULL) == 1)
		goto ns_next_prefix;
	}
	ret = xmlNewNs(NULL, nsName, pref);
	if (ret == NULL)
	    return (NULL);
	if (elem->nsDef == NULL)
	    elem->nsDef = ret;
	else {
	    xmlNsPtr ns2 = elem->nsDef;
	    while (ns2->next != NULL)
		ns2 = ns2->next;
	    ns2->next = ret;
	}
	return (ret);
ns_next_prefix:
	counter++;
	if (counter > 1000)
	    return (NULL);
	if (prefix == NULL) {
	    snprintf((char *) buf, sizeof(buf),
		"ns_%d", counter);
	} else
	    snprintf((char *) buf, sizeof(buf),
	    "%.30s_%d", (char *)prefix, counter);
	pref = BAD_CAST buf;
    }
}